

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

int Saig_StrSimCountMatchedFlops(Aig_Man_t *p)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  lVar2 = (long)p->nRegs;
  if (lVar2 < 1) {
    iVar1 = 0;
  }
  else {
    uVar3 = (ulong)(uint)p->nTruePis;
    iVar1 = 0;
    do {
      if ((p->nTruePis < 0) || (p->vCis->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (p->pReprs == (Aig_Obj_t **)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (uint)(p->pReprs[*(int *)((long)p->vCis->pArray[uVar3] + 0x24)] != (Aig_Obj_t *)0x0)
        ;
      }
      iVar1 = iVar1 + uVar4;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return iVar1;
}

Assistant:

int Saig_StrSimCountMatchedFlops( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( Aig_ObjRepr(p, pObj) )
            Counter++;
    return Counter;
}